

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool trans_LD_zpri(DisasContext_conflict1 *s,arg_rpri_load *a)

{
  byte bVar1;
  int iVar2;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var3;
  undefined1 extraout_AL;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var3 = sve_access_check_aarch64(s);
  if (_Var3) {
    iVar2 = s->sve_len;
    bVar1 = ""[a->dtype];
    ret = new_tmp_a64_aarch64(s);
    arg1 = cpu_reg_sp_aarch64(s,a->rn);
    tcg_gen_addi_i64_aarch64
              (tcg_ctx,ret,arg1,
               (long)((a->nreg + 1) * (iVar2 >> (bVar1 & 0x1f)) * a->imm <<
                     ((char)dtype_mop[a->dtype] & MO_64)));
    do_ld_zpa(s,a->rd,a->pg,ret,a->dtype,a->nreg);
    return (_Bool)extraout_AL;
  }
  return _Var3;
}

Assistant:

static bool trans_LD_zpri(DisasContext *s, arg_rpri_load *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        int vsz = vec_full_reg_size(s);
        int elements = vsz >> dtype_esz[a->dtype];
        TCGv_i64 addr = new_tmp_a64(s);

        tcg_gen_addi_i64(tcg_ctx, addr, cpu_reg_sp(s, a->rn),
                         (a->imm * elements * (a->nreg + 1))
                         << dtype_msz(a->dtype));
        do_ld_zpa(s, a->rd, a->pg, addr, a->dtype, a->nreg);
    }
    return true;
}